

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined1 auVar1 [16];
  uint size;
  uint bucketCount;
  uint uVar2;
  SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *dst;
  size_t byteSize;
  ulong dstCount;
  long lVar3;
  int i;
  long lVar4;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  size = this->count * 2;
  local_34[0] = 0x4b;
  bucketCount = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize(size,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  dstCount = (ulong)(int)size;
  if (bucketCount == this->bucketCount) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dstCount;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    dst = (SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)
          Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              (dst,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = size;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,size);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              ((SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)
               newBuckets,dstCount,this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < this->count; lVar4 = lVar4 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar3)) {
        uVar2 = GetBucket((uint)(*(ulong *)((long)newBuckets + lVar3 + 8) >> 3) | 1,bucketCount,
                          this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar3) = local_48[(int)uVar2];
        local_48[(int)uVar2] = (int)lVar4;
      }
      lVar3 = lVar3 + 0x18;
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,size,size - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = size;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }